

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapcache.cpp
# Opt level: O2

int qt_qpixmapcache_qpixmapcache_total_used(void)

{
  char cVar1;
  Type *pTVar2;
  int iVar3;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_pm_cache>_> *in_RDI;
  
  iVar3 = 0;
  cVar1 = QThread::isMainThread();
  if (cVar1 != '\0') {
    pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_pm_cache>_>::
             operator()(in_RDI);
    iVar3 = (int)(((pTVar2->super_QCache<QPixmapCache::Key,_QPixmapCacheEntry>).total + 0x3ff) /
                 0x400);
  }
  return iVar3;
}

Assistant:

Q_AUTOTEST_EXPORT int qt_qpixmapcache_qpixmapcache_total_used() // for tst_qpixmapcache
{
    if (!qt_pixmapcache_thread_test())
        return 0;
    return (pm_cache()->totalCost()+1023) / 1024;
}